

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_typetraits.cpp
# Opt level: O0

void __thiscall
MxxExperimentalTypeTraits_static_objects_Test::TestBody
          (MxxExperimentalTypeTraits_static_objects_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_2a0;
  AssertHelper local_280;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_240;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_200;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_40;
  Message local_38 [3];
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  MxxExperimentalTypeTraits_static_objects_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  testing::AssertionResult::AssertionResult((AssertionResult *)local_20,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"has_static_member_object_test_member<static_obj>::value","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_70,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_70,
               (AssertionResult *)"has_static_member_object_test_member<static_const_obj>::value",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_b0,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_b0,
               (AssertionResult *)
               "has_static_member_object_test_member<static_constexpr_obj>::value","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_f0,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_f0,
               (AssertionResult *)"has_static_member_object_test_member<no_member>::value","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_130,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_130,
               (AssertionResult *)"has_static_member_object_test_member<nonstatic_obj>::value",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_170,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_170,
               (AssertionResult *)"has_static_member_object_test_member<nonstatic_func>::value",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_1b0,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_1b0,
               (AssertionResult *)"has_static_member_object_test_member<static_func>::value","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_1f0,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_1f0,
               (AssertionResult *)"has_static_member_object_test_member<multiple_funcs>::value",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_230,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_230,
               (AssertionResult *)
               "has_static_member_object_test_member<multiple_static_funcs>::value","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_270,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2a0,(internal *)local_270,
               (AssertionResult *)"has_static_member_object_test_member<multi_mixed_funcs>::value",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_typetraits.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  return;
}

Assistant:

TEST(MxxExperimentalTypeTraits, static_objects) {
    // classes with static objects
    EXPECT_TRUE(has_static_member_object_test_member<static_obj>::value);
    EXPECT_TRUE(has_static_member_object_test_member<static_const_obj>::value);
    EXPECT_TRUE(has_static_member_object_test_member<static_constexpr_obj>::value);

    // classes without static objects
    EXPECT_FALSE(has_static_member_object_test_member<no_member>::value);
    EXPECT_FALSE(has_static_member_object_test_member<nonstatic_obj>::value);
    EXPECT_FALSE(has_static_member_object_test_member<nonstatic_func>::value);
    EXPECT_FALSE(has_static_member_object_test_member<static_func>::value);
    EXPECT_FALSE(has_static_member_object_test_member<multiple_funcs>::value);
    EXPECT_FALSE(has_static_member_object_test_member<multiple_static_funcs>::value);
    EXPECT_FALSE(has_static_member_object_test_member<multi_mixed_funcs>::value);
}